

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixDynSize.cpp
# Opt level: O0

void __thiscall
iDynTree::MatrixDynSize::MatrixDynSize(MatrixDynSize *this,MatrixView<const_double> *other)

{
  element_type eVar1;
  undefined1 auVar2 [16];
  size_t sVar3;
  ulong uVar4;
  double *pdVar5;
  reference peVar6;
  MatrixView<const_double> *in_RSI;
  MatrixDynSize *in_RDI;
  size_t j;
  size_t i;
  double *in_stack_ffffffffffffffc0;
  MatrixView<const_double> *this_00;
  ulong local_20;
  ulong local_18;
  
  in_RDI->_vptr_MatrixDynSize = (_func_int **)&PTR__MatrixDynSize_00852c28;
  this_00 = in_RSI;
  sVar3 = MatrixView<const_double>::rows(in_RSI);
  in_RDI->m_rows = sVar3;
  sVar3 = MatrixView<const_double>::cols(this_00);
  in_RDI->m_cols = sVar3;
  if (in_RDI->m_rows * in_RDI->m_cols == 0) {
    in_RDI->m_capacity = 0;
    in_RDI->m_data = (double *)0x0;
  }
  else {
    in_RDI->m_capacity = in_RDI->m_rows * in_RDI->m_cols;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = in_RDI->m_capacity;
    uVar4 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pdVar5 = (double *)operator_new__(uVar4);
    in_RDI->m_data = pdVar5;
    for (local_18 = 0; local_18 < in_RDI->m_rows; local_18 = local_18 + 1) {
      for (local_20 = 0; local_20 < in_RDI->m_cols; local_20 = local_20 + 1) {
        peVar6 = MatrixView<const_double>::operator()
                           (this_00,(index_type)in_RSI,(index_type)in_stack_ffffffffffffffc0);
        eVar1 = *peVar6;
        in_stack_ffffffffffffffc0 = in_RDI->m_data;
        sVar3 = rawIndexRowMajor(in_RDI,local_18,local_20);
        in_stack_ffffffffffffffc0[sVar3] = eVar1;
      }
    }
  }
  return;
}

Assistant:

MatrixDynSize::MatrixDynSize(MatrixView<const double> other) : m_rows(other.rows()),
                                                                      m_cols(other.cols())
{
    if( this->m_rows*this->m_cols == 0 )
    {
        this->m_capacity = 0;
        this->m_data = 0;
    }
    else
    {
        this->m_capacity = this->m_rows*this->m_cols;
        this->m_data = new double[this->m_capacity];

        // copy the matrix
        for(std::size_t i = 0; i < m_rows; i++)
        {
            for(std::size_t j = 0; j < m_cols; j++)
            {
                this->m_data[this->rawIndexRowMajor(i,j)] = other(i, j);
            }
        }
    }
}